

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

void __thiscall
pbrt::GBufferFilm::WriteImage(GBufferFilm *this,ImageMetadata *metadata,Float splatScale)

{
  pointer pcVar1;
  Image image;
  string local_f0;
  string local_d0;
  Image local_b0;
  
  GetImage(&local_b0,this,metadata,splatScale);
  if (LOGGING_LogLevel < 1) {
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string&,pbrt::Bounds2<int>&>
              (&local_f0,"Writing image %s with bounds %s",&(this->super_FilmBase).filename,
               &(this->super_FilmBase).pixelBounds);
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/film.cpp"
        ,0x281,local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
  }
  pcVar1 = (this->super_FilmBase).filename._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + (this->super_FilmBase).filename._M_string_length);
  Image::Write(&local_b0,&local_d0,metadata);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_b0.p32);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_b0.p16);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
            (&local_b0.p8);
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.channelNames);
  return;
}

Assistant:

void GBufferFilm::WriteImage(ImageMetadata metadata, Float splatScale) {
    Image image = GetImage(&metadata, splatScale);
    LOG_VERBOSE("Writing image %s with bounds %s", filename, pixelBounds);
    image.Write(filename, metadata);
}